

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall
TMatrix3x3<double>::TMatrix3x3(TMatrix3x3<double> *this,Vector3 *axis,double c,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = 1.0 - c;
  dVar7 = axis->Z * s;
  dVar1 = axis->X;
  dVar2 = s * axis->Y;
  dVar4 = dVar3 * dVar1;
  this->Cells[0][0] = dVar1 * dVar4 + c;
  dVar8 = axis->Y * dVar4;
  this->Cells[0][1] = dVar8 - dVar7;
  dVar5 = dVar4 * axis->Z;
  this->Cells[0][2] = dVar2 + dVar5;
  dVar6 = axis->Y * dVar3;
  this->Cells[1][0] = dVar8 + dVar7;
  dVar7 = axis->Y * dVar6;
  this->Cells[1][1] = dVar7 + c;
  dVar6 = dVar6 * axis->Z;
  this->Cells[1][2] = dVar6 - s * dVar1;
  this->Cells[2][0] = dVar5 - dVar2;
  this->Cells[2][1] = dVar6 + s * dVar1;
  this->Cells[2][2] = ((dVar3 - dVar1 * dVar4) - dVar7) + c;
  return;
}

Assistant:

TMatrix3x3(const Vector3 &axis, double c/*cosine*/, double s/*sine*/)
	{
		double t = 1 - c;
		double sx = s*axis.X, sy = s*axis.Y, sz = s*axis.Z;
		double tx, ty, txx, tyy, u, v;

		tx = t*axis.X;
		Cells[0][0] = vec_t( (txx=tx*axis.X) + c );
		Cells[0][1] = vec_t(   (u=tx*axis.Y) - sz);
		Cells[0][2] = vec_t(   (v=tx*axis.Z) + sy);

		ty = t*axis.Y;
		Cells[1][0] = vec_t(              u  + sz);
		Cells[1][1] = vec_t( (tyy=ty*axis.Y) + c );
		Cells[1][2] = vec_t(   (u=ty*axis.Z) - sx);

		Cells[2][0] = vec_t(              v  - sy);
		Cells[2][1] = vec_t(              u  + sx);
		Cells[2][2] = vec_t(     (t-txx-tyy) + c );
	}